

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick.h
# Opt level: O0

void __thiscall entityx::EntityX::EntityX(EntityX *this)

{
  SystemManager *in_RDI;
  EntityManager *in_stack_ffffffffffffffc8;
  SystemManager *this_00;
  
  this_00 = in_RDI;
  entityx::EventManager::EventManager((EventManager *)in_RDI);
  entityx::EntityManager::EntityManager
            ((EntityManager *)&(in_RDI->systems_)._M_h._M_bucket_count,(EventManager *)in_RDI);
  SystemManager::SystemManager(this_00,in_stack_ffffffffffffffc8,(EventManager *)0x319e43);
  return;
}

Assistant:

EntityX() : entities(events), systems(entities, events) {}